

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

Gia_Man_t *
Gia_ManPerformFx(Gia_Man_t *p,int nNewNodesMax,int LitCountMax,int fReverse,int fVerbose,
                int fVeryVerbose)

{
  void *__ptr;
  Gia_Man_t *pGVar1;
  Vec_Wec_t *vCubes;
  long lVar2;
  long lVar3;
  Vec_Str_t *vCompl;
  Vec_Str_t *local_38;
  
  if (p->nObjs == p->vCis->nSize + p->vCos->nSize + 1) {
    pGVar1 = Gia_ManDup(p);
    return pGVar1;
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    vCubes = Gia_ManFxRetrieve(p,&local_38,fReverse);
    Fx_FastExtract(vCubes,local_38->nSize,nNewNodesMax,LitCountMax,0,fVerbose,fVeryVerbose);
    pGVar1 = Gia_ManFxInsert(p,vCubes,local_38);
    Gia_ManTransferTiming(pGVar1,p);
    if (0 < vCubes->nCap) {
      lVar2 = 8;
      lVar3 = 0;
      do {
        __ptr = *(void **)((long)&vCubes->pArray->nCap + lVar2);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&vCubes->pArray->nCap + lVar2) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 < vCubes->nCap);
    }
    if (vCubes->pArray != (Vec_Int_t *)0x0) {
      free(vCubes->pArray);
      vCubes->pArray = (Vec_Int_t *)0x0;
    }
    vCubes->nCap = 0;
    vCubes->nSize = 0;
    free(vCubes);
    if (local_38->pArray != (char *)0x0) {
      free(local_38->pArray);
      local_38->pArray = (char *)0x0;
    }
    if (local_38 != (Vec_Str_t *)0x0) {
      free(local_38);
    }
    return pGVar1;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                ,0x1d1,"Gia_Man_t *Gia_ManPerformFx(Gia_Man_t *, int, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformFx( Gia_Man_t * p, int nNewNodesMax, int LitCountMax, int fReverse, int fVerbose, int fVeryVerbose )
{
    extern int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose );
    Gia_Man_t * pNew = NULL;
    Vec_Wec_t * vCubes;
    Vec_Str_t * vCompl;
    if ( Gia_ManAndNum(p) == 0 )
        return Gia_ManDup(p);
//    abctime clk;
    assert( Gia_ManHasMapping(p) );   
    // collect information
    vCubes = Gia_ManFxRetrieve( p, &vCompl, fReverse );
    // call the fast extract procedure
//    clk = Abc_Clock();
    Fx_FastExtract( vCubes, Vec_StrSize(vCompl), nNewNodesMax, LitCountMax, 0, fVerbose, fVeryVerbose );
//    Abc_PrintTime( 1, "Fx runtime", Abc_Clock() - clk );
    // insert information
    pNew = Gia_ManFxInsert( p, vCubes, vCompl );
    Gia_ManTransferTiming( pNew, p );
    // cleanup
    Vec_WecFree( vCubes );
    Vec_StrFree( vCompl );
    return pNew;
}